

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_utffilter.h
# Opt level: O1

void __thiscall JSONUTF8StringFilter::push_back(JSONUTF8StringFilter *this,uchar ch)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (uint)CONCAT71(in_register_00000031,ch);
  if (this->state == 0) {
    if (-1 < (char)ch) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this->str,ch);
        return;
      }
      goto LAB_00187e27;
    }
    if (ch < 0xc0) {
LAB_00187dd3:
      this->is_valid = false;
    }
    else if (ch < 0xe0) {
      this->codepoint = (uVar3 & 0x1f) << 6;
      this->state = 6;
    }
    else if (ch < 0xf0) {
      this->codepoint = (uVar3 & 0xf) << 0xc;
      this->state = 0xc;
    }
    else {
      if (0xf7 < ch) goto LAB_00187dd3;
      this->codepoint = (uVar3 & 7) << 0x12;
      this->state = 0x12;
    }
  }
  else {
    if ((uVar3 & 0xffffffc0) != 0x80) {
      this->is_valid = false;
    }
    iVar2 = this->state + -6;
    this->state = iVar2;
    uVar3 = (uVar3 & 0x3f) << ((byte)iVar2 & 0x1f) | this->codepoint;
    this->codepoint = uVar3;
    if (iVar2 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        push_back_u(this,uVar3);
        return;
      }
      goto LAB_00187e27;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00187e27:
  __stack_chk_fail();
}

Assistant:

void push_back(unsigned char ch)
    {
        if (state == 0) {
            if (ch < 0x80) // 7-bit ASCII, fast direct pass-through
                str.push_back(ch);
            else if (ch < 0xc0) // Mid-sequence character, invalid in this state
                is_valid = false;
            else if (ch < 0xe0) { // Start of 2-byte sequence
                codepoint = (ch & 0x1f) << 6;
                state = 6;
            } else if (ch < 0xf0) { // Start of 3-byte sequence
                codepoint = (ch & 0x0f) << 12;
                state = 12;
            } else if (ch < 0xf8) { // Start of 4-byte sequence
                codepoint = (ch & 0x07) << 18;
                state = 18;
            } else // Reserved, invalid
                is_valid = false;
        } else {
            if ((ch & 0xc0) != 0x80) // Not a continuation, invalid
                is_valid = false;
            state -= 6;
            codepoint |= (ch & 0x3f) << state;
            if (state == 0)
                push_back_u(codepoint);
        }
    }